

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O2

void av1_build_compound_diffwtd_mask_c
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w)

{
  uint uVar1;
  undefined4 in_register_0000000c;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000031;
  undefined4 in_register_0000008c;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int in_stack_00000018;
  
  iVar4 = (int)CONCAT71(in_register_00000031,mask_type);
  if (iVar4 == 0) {
    uVar6 = 0;
    uVar2 = 0;
    if (0 < w) {
      uVar2 = (ulong)(uint)w;
    }
    uVar5 = (ulong)(uint)h;
    if (h < 1) {
      uVar5 = uVar6;
    }
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
        uVar3 = (uint)src0[uVar7] - (uint)src1[uVar7];
        uVar1 = -uVar3;
        if (0 < (int)uVar3) {
          uVar1 = uVar3;
        }
        mask[uVar7] = (char)(((ulong)uVar1 & 0xff) >> 4) + '&';
      }
      mask = mask + w;
      src1 = src1 + src1_stride;
      src0 = src0 + src0_stride;
    }
    return;
  }
  if (iVar4 != 1) {
    return;
  }
  diffwtd_mask(mask,1,(int)src0,(uint8_t *)CONCAT44(in_register_0000000c,src0_stride),(int)src1,
               (uint8_t *)CONCAT44(in_register_0000008c,src1_stride),h,w,in_stack_00000018);
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_c(uint8_t *mask,
                                       DIFFWTD_MASK_TYPE mask_type,
                                       const uint8_t *src0, int src0_stride,
                                       const uint8_t *src1, int src1_stride,
                                       int h, int w) {
  switch (mask_type) {
    case DIFFWTD_38:
      diffwtd_mask(mask, 0, 38, src0, src0_stride, src1, src1_stride, h, w);
      break;
    case DIFFWTD_38_INV:
      diffwtd_mask(mask, 1, 38, src0, src0_stride, src1, src1_stride, h, w);
      break;
    default: assert(0);
  }
}